

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_boxidiff(LispPTR a,LispPTR tos)

{
  LispPTR *pLVar1;
  LispPTR LVar2;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (a >> 9)) ^ 2) & 0x7ff) == 2) {
    if ((tos & 0xfff0000) == 0xf0000) {
      LVar2 = tos | 0xffff0000;
    }
    else if ((tos & 0xfff0000) == 0xe0000) {
      LVar2 = tos & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00107323;
      pLVar1 = NativeAligned4FromLAddr(tos);
      LVar2 = *pLVar1;
    }
    pLVar1 = NativeAligned4FromLAddr(a);
    *pLVar1 = *pLVar1 - LVar2;
  }
  else {
LAB_00107323:
    MachineState.errorexit = 1;
    a = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return a;
}

Assistant:

LispPTR N_OP_boxidiff(LispPTR a, LispPTR tos) {
  int arg2;

  if (GetTypeNumber(a) == TYPE_FIXP) {
    N_GETNUMBER(tos, arg2, bad);
    *((int *)NativeAligned4FromLAddr(a)) -= arg2;
    return (a);
  }
bad:
  ERROR_EXIT(tos);

}